

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefAs
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefAs *curr)

{
  RefAsOp RVar1;
  bool bVar2;
  Literal *this_00;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  undefined1 local_70 [8];
  Flow flow;
  
  visit((Flow *)local_70,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_70 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    RVar1 = curr->op;
    if (RVar1 == RefAsNonNull) {
      bVar2 = Literal::isNull((Literal *)&flow);
      if (bVar2) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      ::wasm::Literal::Literal(&local_b8,(Literal *)&flow);
      Flow::Flow(__return_storage_ptr__,&local_b8);
      this_00 = &local_b8;
    }
    else if (RVar1 == ExternInternalize) {
      ::wasm::Literal::internalize();
      Flow::Flow(__return_storage_ptr__,&local_a0);
      this_00 = &local_a0;
    }
    else {
      if (RVar1 != ExternExternalize) {
        ::wasm::handle_unreachable
                  ("unimplemented ref.as_*",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x72c);
      }
      ::wasm::Literal::externalize();
      Flow::Flow(__return_storage_ptr__,&local_88);
      this_00 = &local_88;
    }
    ::wasm::Literal::~Literal(this_00);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_70;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefAs(RefAs* curr) {
    NOTE_ENTER("RefAs");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case RefAsNonNull:
        if (value.isNull()) {
          trap("null ref");
        }
        return value;
      case ExternInternalize:
        return value.internalize();
      case ExternExternalize:
        return value.externalize();
    }
    WASM_UNREACHABLE("unimplemented ref.as_*");
  }